

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

buffer_ptr<duckdb::DictionaryBuffer> __thiscall
duckdb::make_buffer<duckdb::DictionaryBuffer,duckdb::SelectionVector&>
          (duckdb *this,SelectionVector *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  buffer_ptr<duckdb::DictionaryBuffer> bVar2;
  undefined1 local_21;
  DictionaryBuffer *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (DictionaryBuffer *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DictionaryBuffer,std::allocator<duckdb::DictionaryBuffer>,duckdb::SelectionVector&>
            (&local_18,&local_20,(allocator<duckdb::DictionaryBuffer> *)&local_21,args);
  *(DictionaryBuffer **)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  bVar2.internal.super___shared_ptr<duckdb::DictionaryBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  bVar2.internal.super___shared_ptr<duckdb::DictionaryBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (buffer_ptr<duckdb::DictionaryBuffer>)
         bVar2.internal.super___shared_ptr<duckdb::DictionaryBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

buffer_ptr<T> make_buffer(ARGS &&...args) { // NOLINT: mimic std casing
	return make_shared_ptr<T>(std::forward<ARGS>(args)...);
}